

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadDsd.c
# Opt level: O1

int Io_ReadDsdStrSplit(char *pCur,char **pParts,int *pTypeXor)

{
  char cVar1;
  byte bVar2;
  char *pcVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  char *__s;
  
  if (*pCur == '\0') {
    __assert_fail("*pCur",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioReadDsd.c"
                  ,0x4c,"int Io_ReadDsdStrSplit(char *, char **, int *)");
  }
  lVar8 = 0;
  __s = "Wrong separating symbol.";
  uVar7 = 0;
  uVar6 = 0;
  uVar5 = 0;
  do {
    pParts[lVar8] = pCur;
    lVar8 = lVar8 + 1;
    uVar4 = (ulong)(*pCur == '!');
    if ((byte)(pCur[uVar4] + 0x9fU) < 0x1a) {
      pcVar3 = pCur + uVar4;
    }
    else {
      pcVar3 = pCur + (uVar4 - 1);
      do {
        cVar1 = pcVar3[1];
        pcVar3 = pcVar3 + 1;
      } while ((byte)(cVar1 + 0xbfU) < 6 || (byte)(cVar1 - 0x30U) < 10);
      if (cVar1 != '(') {
        __s = "Cannot find the opening parenthesis.";
        goto LAB_0033239b;
      }
      pcVar3 = Io_ReadDsdFindEnd(pcVar3);
      if (pcVar3 == (char *)0x0) {
        __s = "Cannot find the closing parenthesis.";
        goto LAB_0033239b;
      }
    }
    bVar2 = pcVar3[1];
    if (2 < bVar2 - 0x2a) {
      if (bVar2 != 0) {
LAB_0033239b:
        puts(__s);
      }
      if (uVar7 + uVar6 + uVar5 < 2) {
        *pTypeXor = uVar6;
      }
      else {
        puts("Different types of separating symbol ennPartsed.");
        lVar8 = 0;
      }
      return (int)lVar8;
    }
    uVar7 = uVar7 | bVar2 == 0x2a;
    uVar6 = uVar6 | bVar2 == 0x2b;
    uVar5 = uVar5 | bVar2 == 0x2c;
    pcVar3[1] = '\0';
    pCur = pcVar3 + 2;
  } while( true );
}

Assistant:

int Io_ReadDsdStrSplit( char * pCur, char * pParts[], int * pTypeXor )
{
    int fAnd = 0, fXor = 0, fPri = 0, nParts = 0;
    assert( *pCur );
    // process the parts
    while ( 1 )
    {
        // save the current part
        pParts[nParts++] = pCur;
        // skip the complement
        if ( *pCur == '!' )
            pCur++;
        // skip var
        if ( *pCur >= 'a' && *pCur <= 'z' )
            pCur++;
        else
        {
            // skip hex truth table
            while ( (*pCur >= '0' && *pCur <= '9') || (*pCur >= 'A' && *pCur <= 'F') )
                pCur++;
            // process parentheses
            if ( *pCur != '(' )
            {
                printf( "Cannot find the opening parenthesis.\n" );
                break;
            }
            // find the corresponding closing parenthesis
            pCur = Io_ReadDsdFindEnd( pCur );
            if ( pCur == NULL )
            {
                printf( "Cannot find the closing parenthesis.\n" );
                break;
            }
            pCur++;
        }
        // check the end
        if ( *pCur == 0 )
            break;
        // check symbol
        if ( *pCur != '*' && *pCur != '+' && *pCur != ',' )
        {
            printf( "Wrong separating symbol.\n" );
            break;
        }
        // remember the symbol
        fAnd |= (*pCur == '*');
        fXor |= (*pCur == '+');
        fPri |= (*pCur == ',');
        *pCur++ = 0;
    }
    // check separating symbols
    if ( fAnd + fXor + fPri > 1 )
    {
        printf( "Different types of separating symbol ennPartsed.\n" );
        return 0;
    }
    *pTypeXor = fXor;
    return nParts;
}